

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O2

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  long lVar1;
  size_t size_00;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long depth;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  long j;
  long lVar20;
  long i3;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  double *pdVar25;
  ulong uVar26;
  double dStack_1c8;
  ptrdiff_t local_1c0;
  ptrdiff_t l1;
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  ptrdiff_t l2;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  long local_d0;
  double *local_c8;
  double *local_a8;
  long local_90;
  RhsScalar *local_88;
  long cols;
  double *local_70;
  double *local_58;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> local_41;
  double *pdStack_40;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_31 [7];
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  
  pdVar8 = &dStack_1c8;
  lVar3 = blocking->m_kc;
  lVar24 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar24 = size;
  }
  pdVar25 = (double *)(lVar24 * lVar3);
  if ((ulong)pdVar25 >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  pdVar23 = (double *)(lVar3 * otherSize);
  local_58 = blocking->m_blockA;
  uVar26 = (long)pdVar25 * 8;
  if (local_58 == (LhsScalar *)0x0) {
    if (uVar26 < 0x20001) {
      l1 = (long)&dStack_1c8 - (uVar26 + 0xf & 0xfffffffffffffff0);
      blockA_stack_memory_destructor.m_size._0_1_ = false;
      pdVar8 = (double *)l1;
      local_58 = (double *)l1;
    }
    else {
      local_58 = (double *)aligned_malloc(uVar26);
      l1 = (ptrdiff_t)(double *)0x0;
      if (blocking->m_blockA == (LhsScalar *)0x0) {
        l1 = (ptrdiff_t)local_58;
      }
      blockA_stack_memory_destructor.m_size._0_1_ = true;
    }
  }
  else {
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < uVar26;
    l1 = 0;
    pdVar8 = &dStack_1c8;
  }
  blockA_stack_memory_destructor.m_ptr = pdVar25;
  if ((double *)0x1fffffffffffffff < pdVar23) {
    pdVar8[-1] = 5.37609133406173e-318;
    throw_std_bad_alloc();
  }
  size_00 = (long)pdVar23 * 8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (size_00 < 0x20001) {
      pdVar8 = (double *)((long)pdVar8 - (size_00 + 0xf & 0xfffffffffffffff0));
      blockA_stack_memory_destructor._16_8_ = pdVar8;
      cols = (long)pdVar8;
    }
    else {
      pdVar8[-1] = 5.37641741738799e-318;
      cols = (long)aligned_malloc(size_00);
      blockA_stack_memory_destructor._16_8_ = (undefined1 *)0x0;
      if (blocking->m_blockB == (RhsScalar *)0x0) {
        blockA_stack_memory_destructor._16_8_ = cols;
      }
    }
  }
  else {
    blockA_stack_memory_destructor._16_8_ = (undefined1 *)0x0;
    cols = (long)blocking->m_blockB;
  }
  blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
  blockB_stack_memory_destructor.m_ptr = pdVar23;
  if ((double *)0x1fffffffffffffff < (double *)(lVar3 * 8)) {
    *(undefined8 *)((long)pdVar8 + -8) = 0x109b1a;
    throw_std_bad_alloc();
  }
  uVar26 = lVar3 * 0x40;
  if (blocking->m_blockW == (RhsScalar *)0x0) {
    if (uVar26 < 0x20001) {
      pdVar8 = (double *)((long)pdVar8 + lVar3 * -0x40);
      blockB_stack_memory_destructor._16_8_ = pdVar8;
      local_88 = pdVar8;
    }
    else {
      *(undefined8 *)((long)pdVar8 + -8) = 0x109b63;
      local_88 = (RhsScalar *)aligned_malloc(uVar26);
      blockB_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
      if (blocking->m_blockW == (RhsScalar *)0x0) {
        blockB_stack_memory_destructor._16_8_ = local_88;
      }
    }
  }
  else {
    blockB_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
    local_88 = blocking->m_blockW;
  }
  blockW_stack_memory_destructor.m_size._0_1_ = 0x20000 < uVar26;
  blockW_stack_memory_destructor.m_ptr = (double *)(lVar3 * 8);
  pdVar8[-1] = 5.3775438870605e-318;
  manage_caching_sizes
            (GetAction,&local_1c0,(ptrdiff_t *)&blockW_stack_memory_destructor.m_deallocate);
  pdVar8[-1] = 1.97626258336499e-323;
  if (otherSize < 1) {
    lVar4 = 0;
  }
  else {
    lVar4 = size;
    if (size < otherStride) {
      lVar4 = otherStride;
    }
    lVar4 = (long)((ulong)blockW_stack_memory_destructor._16_8_ / (ulong)(lVar4 << 5)) /
            (long)pdVar8[-1] << 2;
  }
  if (lVar4 < 5) {
    lVar4 = (long)pdVar8[-1];
  }
  local_e8 = _tri + 1;
  lVar15 = lVar3 * (triStride * 8 + 8);
  local_e0 = _other + 1;
  local_d8 = _tri + lVar3;
  local_d0 = size - lVar3;
  local_c8 = _other + lVar3;
  local_90 = 0;
  lVar13 = size;
  while( true ) {
    lVar7 = lVar13;
    if (lVar3 < lVar13) {
      lVar7 = lVar3;
    }
    depth = size - local_90;
    if (depth == 0 || size < local_90) break;
    if (lVar3 < depth) {
      depth = lVar3;
    }
    local_a8 = local_e0;
    for (lVar11 = 0; lVar6 = otherSize - lVar11, lVar6 != 0 && lVar11 <= otherSize;
        lVar11 = lVar11 + lVar4) {
      if (lVar4 < lVar6) {
        lVar6 = lVar4;
      }
      pdVar25 = (double *)(cols + lVar11 * depth * 8);
      lVar22 = 0;
      lVar10 = lVar7;
      pdVar23 = local_a8;
      pdVar16 = local_e8;
      while( true ) {
        pdVar8[-1] = 1.97626258336499e-323;
        lVar5 = (long)pdVar8[-1];
        if (lVar10 < 4) {
          lVar5 = lVar10;
        }
        lVar18 = 0;
        if (0 < lVar5) {
          lVar18 = lVar5;
        }
        pdStack_40 = (double *)(depth - lVar22);
        if (pdStack_40 == (double *)0x0 || depth < lVar22) break;
        lVar1 = lVar22 + local_90;
        lVar14 = 0;
        pdVar9 = pdVar23;
        pdVar12 = pdVar16;
        lVar20 = (long)pdStack_40;
        while( true ) {
          lVar5 = lVar5 + -1;
          lVar17 = 0;
          if (0 < lVar5) {
            lVar17 = lVar5;
          }
          if (lVar14 == lVar18) break;
          pdVar19 = pdVar9;
          for (lVar20 = lVar11; lVar20 < lVar6 + lVar11; lVar20 = lVar20 + 1) {
            dVar2 = _other[lVar20 * otherStride + lVar1 + lVar14];
            for (lVar21 = 0; lVar17 != lVar21; lVar21 = lVar21 + 1) {
              pdVar19[lVar21] = pdVar12[lVar21] * -dVar2 + pdVar19[lVar21];
            }
            pdVar19 = pdVar19 + otherStride;
          }
          lVar14 = lVar14 + 1;
          pdVar12 = pdVar12 + triStride + 1;
          pdVar9 = pdVar9 + 1;
          lVar20 = (long)pdStack_40;
        }
        pdVar8[-1] = 1.97626258336499e-323;
        lVar5 = (long)pdVar8[-1];
        if (lVar20 < 4) {
          lVar5 = lVar20;
        }
        pdVar8[-1] = (double)lVar22;
        pdVar8[-2] = (double)depth;
        pdVar8[-3] = 5.38108633774119e-318;
        gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                  (&local_41,pdVar25,_other + lVar11 * otherStride + lVar1,otherStride,lVar5,lVar6,
                   (long)pdVar8[-2],(long)pdVar8[-1]);
        lVar18 = (long)pdStack_40 - lVar5;
        if (lVar18 != 0 && lVar5 <= (long)pdStack_40) {
          pdStack_40 = (double *)(lVar5 + lVar1);
          pdVar8[-2] = 0.0;
          pdVar8[-1] = 0.0;
          pdVar8[-3] = 5.38155570010474e-318;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    (local_31,local_58,_tri + lVar1 * triStride + lVar5 + lVar1,triStride,lVar5,
                     lVar18,(long)pdVar8[-2],(long)pdVar8[-1]);
          lVar1 = lVar11 * otherStride + (long)pdStack_40;
          pdVar8[-2] = (double)local_88;
          pdVar8[-3] = (double)lVar22;
          pdVar8[-4] = 0.0;
          pdVar8[-5] = (double)depth;
          pdVar8[-6] = (double)lVar5;
          pdVar8[-7] = (double)lVar6;
          pdVar8[-8] = (double)lVar5;
          pdVar8[-9] = 5.38195589327787e-318;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    (&local_32,_other + lVar1,otherStride,local_58,pdVar25,lVar18,(long)pdVar8[-8],
                     (long)pdVar8[-7],-1.0,(long)pdVar8[-6],(long)pdVar8[-5],(long)pdVar8[-4],
                     (long)pdVar8[-3],(double *)pdVar8[-2]);
        }
        lVar22 = lVar22 + 4;
        lVar10 = lVar10 + -4;
        pdVar16 = pdVar16 + triStride * 4 + 4;
        pdVar23 = pdVar23 + 4;
      }
      local_a8 = local_a8 + otherStride * lVar4;
    }
    local_70 = local_c8;
    pdStack_40 = local_d8;
    local_90 = local_90 + lVar3;
    lVar11 = local_d0;
    for (lVar7 = local_90; lVar7 < size; lVar7 = lVar7 + lVar24) {
      lVar6 = lVar11;
      if (lVar24 <= lVar11) {
        lVar6 = lVar24;
      }
      if (0 < lVar6) {
        pdVar8[-2] = 0.0;
        pdVar8[-1] = 0.0;
        pdVar25 = pdStack_40;
        pdVar8[-3] = 5.38311200688914e-318;
        gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                  (local_31,local_58,pdVar25,triStride,depth,lVar6,(long)pdVar8[-2],(long)pdVar8[-1]
                  );
        pdVar8[-2] = (double)local_88;
        pdVar8[-4] = 0.0;
        pdVar8[-3] = 0.0;
        pdVar8[-5] = -NAN;
        pdVar8[-7] = (double)otherSize;
        pdVar8[-6] = -NAN;
        pdVar8[-8] = (double)depth;
        pdVar8[-9] = 5.38356160662685e-318;
        gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                  (&local_32,local_70,otherStride,local_58,(double *)cols,lVar6,(long)pdVar8[-8],
                   (long)pdVar8[-7],-1.0,(long)pdVar8[-6],(long)pdVar8[-5],(long)pdVar8[-4],
                   (long)pdVar8[-3],(double *)pdVar8[-2]);
      }
      pdStack_40 = pdStack_40 + lVar24;
      local_70 = local_70 + lVar24;
      lVar11 = lVar11 - lVar24;
    }
    lVar13 = lVar13 - lVar3;
    local_e8 = (double *)((long)local_e8 + lVar15);
    local_e0 = local_e0 + lVar3;
    local_d8 = (double *)((long)local_d8 + lVar15);
    local_d0 = local_d0 - lVar3;
    local_c8 = local_c8 + lVar3;
  }
  pdVar8[-1] = 5.38419401065353e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockB_stack_memory_destructor.m_deallocate);
  pdVar8[-1] = 5.38425329853103e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  pdVar8[-1] = 5.38431258640853e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&l1);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) *  std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }